

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O1

reference __thiscall
slang::SmallVectorBase<std::__cxx11::string>::emplace_back<std::__cxx11::string>
          (SmallVectorBase<std::__cxx11::string> *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  reference pbVar2;
  undefined8 *puVar3;
  pointer pcVar4;
  ulong uVar5;
  undefined8 uVar6;
  long lVar7;
  void *pvVar8;
  EVP_PKEY_CTX *pEVar9;
  EVP_PKEY_CTX *pEVar10;
  long lVar11;
  long *plVar12;
  ulong uVar13;
  EVP_PKEY_CTX *pEVar14;
  EVP_PKEY_CTX *ctx;
  long lVar15;
  
  pEVar14 = (EVP_PKEY_CTX *)(*(long *)(this + 8) * 0x20 + *(long *)this);
  if (*(long *)(this + 8) != *(long *)(this + 0x10)) {
    *(EVP_PKEY_CTX **)pEVar14 = pEVar14 + 0x10;
    pcVar4 = (args->_M_dataplus)._M_p;
    paVar1 = &args->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar4 == paVar1) {
      lVar15 = *(long *)((long)&args->field_2 + 8);
      *(size_type *)(pEVar14 + 0x10) = paVar1->_M_allocated_capacity;
      *(long *)(pEVar14 + 0x18) = lVar15;
    }
    else {
      *(pointer *)pEVar14 = pcVar4;
      *(size_type *)(pEVar14 + 0x10) = paVar1->_M_allocated_capacity;
    }
    *(size_type *)(pEVar14 + 8) = args->_M_string_length;
    (args->_M_dataplus)._M_p = (pointer)paVar1;
    args->_M_string_length = 0;
    (args->field_2)._M_local_buf[0] = '\0';
    lVar15 = *(long *)(this + 8);
    *(long *)(this + 8) = lVar15 + 1;
    return (reference)(*(long *)this + (lVar15 + 1) * 0x20 + -0x20);
  }
  if (*(long *)(this + 8) == 0x3ffffffffffffff) {
    detail::throwLengthError();
  }
  uVar13 = *(long *)(this + 8) + 1;
  uVar5 = *(ulong *)(this + 0x10);
  if (uVar13 < uVar5 * 2) {
    uVar13 = uVar5 * 2;
  }
  if (0x3ffffffffffffff - uVar5 < uVar5) {
    uVar13 = 0x3ffffffffffffff;
  }
  lVar15 = (long)pEVar14 - *(long *)this;
  pvVar8 = operator_new(uVar13 << 5);
  pbVar2 = (reference)((long)pvVar8 + lVar15);
  puVar3 = (undefined8 *)((long)pvVar8 + lVar15);
  *puVar3 = puVar3 + 2;
  pcVar4 = (args->_M_dataplus)._M_p;
  paVar1 = &args->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar4 == paVar1) {
    uVar6 = *(undefined8 *)((long)&args->field_2 + 8);
    puVar3[2] = paVar1->_M_allocated_capacity;
    puVar3[3] = uVar6;
  }
  else {
    (pbVar2->_M_dataplus)._M_p = pcVar4;
    (pbVar2->field_2)._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  pbVar2->_M_string_length = args->_M_string_length;
  (args->_M_dataplus)._M_p = (pointer)paVar1;
  args->_M_string_length = 0;
  (args->field_2)._M_local_buf[0] = '\0';
  pEVar10 = *(EVP_PKEY_CTX **)this;
  lVar11 = *(long *)(this + 8) * 0x20;
  ctx = pEVar10 + lVar11;
  if (ctx == pEVar14) {
    if (*(long *)(this + 8) != 0) {
      plVar12 = (long *)((long)pvVar8 + 0x10);
      pEVar10 = pEVar10 + 0x10;
      do {
        plVar12[-2] = (long)plVar12;
        if (pEVar10 == *(EVP_PKEY_CTX **)(pEVar10 + -0x10)) {
          lVar15 = *(long *)(pEVar10 + 8);
          *plVar12 = *(long *)pEVar10;
          plVar12[1] = lVar15;
        }
        else {
          plVar12[-2] = (long)*(EVP_PKEY_CTX **)(pEVar10 + -0x10);
          *plVar12 = *(long *)pEVar10;
        }
        ctx = *(EVP_PKEY_CTX **)(pEVar10 + -8);
        plVar12[-1] = (long)ctx;
        *(EVP_PKEY_CTX **)(pEVar10 + -0x10) = pEVar10;
        *(long *)(pEVar10 + -8) = 0;
        *pEVar10 = (EVP_PKEY_CTX)0x0;
        plVar12 = plVar12 + 4;
        pEVar10 = pEVar10 + 0x20;
        lVar11 = lVar11 + -0x20;
      } while (lVar11 != 0);
    }
  }
  else {
    if (pEVar10 != pEVar14) {
      plVar12 = (long *)((long)pvVar8 + 0x10);
      pEVar10 = pEVar10 + 0x10;
      do {
        plVar12[-2] = (long)plVar12;
        if (pEVar10 == *(EVP_PKEY_CTX **)(pEVar10 + -0x10)) {
          lVar11 = *(long *)(pEVar10 + 8);
          *plVar12 = *(long *)pEVar10;
          plVar12[1] = lVar11;
        }
        else {
          plVar12[-2] = (long)*(EVP_PKEY_CTX **)(pEVar10 + -0x10);
          *plVar12 = *(long *)pEVar10;
        }
        plVar12[-1] = *(long *)(pEVar10 + -8);
        *(EVP_PKEY_CTX **)(pEVar10 + -0x10) = pEVar10;
        *(long *)(pEVar10 + -8) = 0;
        *pEVar10 = (EVP_PKEY_CTX)0x0;
        plVar12 = plVar12 + 4;
        pEVar9 = pEVar10 + 0x10;
        pEVar10 = pEVar10 + 0x20;
      } while (pEVar9 != pEVar14);
    }
    pEVar10 = (EVP_PKEY_CTX *)(*(long *)(this + 8) * 0x20 + *(long *)this);
    if (pEVar10 != pEVar14) {
      lVar11 = 0;
      do {
        plVar12 = (long *)((long)pvVar8 + lVar11 + lVar15 + 0x30);
        *(long **)((long)pvVar8 + lVar11 + lVar15 + 0x20) = plVar12;
        pEVar9 = pEVar14 + lVar11;
        ctx = pEVar9 + 0x10;
        if (ctx == *(EVP_PKEY_CTX **)pEVar9) {
          lVar7 = *(long *)(pEVar9 + 0x18);
          *plVar12 = *(long *)ctx;
          plVar12[1] = lVar7;
        }
        else {
          *(EVP_PKEY_CTX **)((long)pvVar8 + lVar11 + lVar15 + 0x20) = *(EVP_PKEY_CTX **)pEVar9;
          *(long *)((long)pvVar8 + lVar11 + lVar15 + 0x30) = *(long *)ctx;
        }
        pEVar9 = pEVar14 + lVar11;
        *(undefined8 *)((long)pvVar8 + lVar11 + lVar15 + 0x28) = *(undefined8 *)(pEVar9 + 8);
        *(EVP_PKEY_CTX **)pEVar9 = ctx;
        *(undefined8 *)(pEVar9 + 8) = 0;
        pEVar9[0x10] = (EVP_PKEY_CTX)0x0;
        lVar11 = lVar11 + 0x20;
      } while (pEVar9 + 0x20 != pEVar10);
    }
  }
  SmallVectorBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::cleanup((SmallVectorBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)this,ctx);
  *(long *)(this + 8) = *(long *)(this + 8) + 1;
  *(ulong *)(this + 0x10) = uVar13;
  *(void **)this = pvVar8;
  return pbVar2;
}

Assistant:

reference emplace_back(Args&&... args) {
        if (len == cap)
            return *emplaceRealloc(end(), std::forward<Args>(args)...);

        new (end()) T(std::forward<Args>(args)...);
        len++;
        return back();
    }